

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDebugReportUtil.cpp
# Opt level: O3

VkBool32 vk::anon_unknown_0::debugReportCallback
                   (VkDebugReportFlagsEXT flags,VkDebugReportObjectTypeEXT objectType,
                   deUint64 object,size_t location,deInt32 messageCode,char *pLayerPrefix,
                   char *pMessage,void *pUserData)

{
  allocator<char> local_d2;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  DebugReportMessage local_90;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,pLayerPrefix,&local_d1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pMessage,&local_d2);
  DebugReportMessage::DebugReportMessage
            (&local_90,flags,objectType,object,location,messageCode,&local_d0,&local_b0);
  de::AppendList<vk::DebugReportMessage>::append
            ((AppendList<vk::DebugReportMessage> *)pUserData,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.message._M_dataplus._M_p != &local_90.message.field_2) {
    operator_delete(local_90.message._M_dataplus._M_p,
                    local_90.message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.layerPrefix._M_dataplus._M_p != &local_90.layerPrefix.field_2) {
    operator_delete(local_90.layerPrefix._M_dataplus._M_p,
                    local_90.layerPrefix.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

VKAPI_ATTR VkBool32	VKAPI_CALL debugReportCallback (VkDebugReportFlagsEXT		flags,
													VkDebugReportObjectTypeEXT	objectType,
													deUint64					object,
													size_t						location,
													deInt32						messageCode,
													const char*					pLayerPrefix,
													const char*					pMessage,
													void*						pUserData)
{
	DebugReportRecorder::MessageList* const	messageList	= reinterpret_cast<DebugReportRecorder::MessageList*>(pUserData);

	messageList->append(DebugReportMessage(flags, objectType, object, location, messageCode, pLayerPrefix, pMessage));

	// Return false to indicate that the call should not return error and should
	// continue execution normally.
	return VK_FALSE;
}